

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

NumericTable * __thiscall
notch::io::CSVReader::convertToNumeric
          (NumericTable *__return_storage_ptr__,CSVReader *this,MixedTable *t)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  pointer pCVar1;
  pointer pCVar2;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> *pvVar3;
  long lVar4;
  pointer pmVar5;
  __normal_iterator<const_std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_*,_std::vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>_>
  _Var6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  long lVar10;
  float *__args;
  int iVar11;
  ulong uVar12;
  pointer pvVar13;
  ulong uVar14;
  long lVar15;
  size_type __n;
  ulong uVar16;
  NumericRow nr;
  vector<bool,_std::allocator<bool>_> isNumeric;
  string label;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  columnKeys;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> row;
  float local_ec;
  vector<float,_std::allocator<float>_> local_e8;
  NumericTable *local_d0;
  vector<bool,_std::allocator<bool>_> local_c8;
  key_type local_a0;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> *local_68;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  local_60;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> local_48;
  
  pvVar13 = (t->
            super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = __return_storage_ptr__;
  if ((t->
      super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    pCVar1 = (pvVar13->
             super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (pvVar13->
             super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __n = ((long)pCVar2 - (long)pCVar1 >> 3) * -0x3333333333333333;
    local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffffffffff00;
    core::std::vector<bool,_std::allocator<bool>_>::vector
              (&local_c8,__n,(bool *)&local_a0,(allocator_type *)&local_60);
    local_78 = pCVar2;
    local_70 = pCVar1;
    if (pCVar2 != pCVar1) {
      uVar16 = 0;
      do {
        pvVar3 = (t->
                 super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>const*,std::vector<std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>,std::allocator<std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>>>>,__gnu_cxx::__ops::_Iter_negate<notch::io::CSVReader::isColumnNumeric(std::vector<std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>,std::allocator<std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>>>const&,unsigned_long)::_lambda(std::vector<notch::io::CSVReader::Cell,std::allocator<notch::io::CSVReader::Cell>>const&)_1_>>
                          ((t->
                           super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,pvVar3,uVar16);
        uVar12 = uVar16 + 0x3f;
        if (-1 < (long)uVar16) {
          uVar12 = uVar16;
        }
        lVar10 = (long)uVar12 >> 6;
        uVar14 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
        uVar12 = 1L << ((byte)uVar16 & 0x3f);
        if (_Var6._M_current == pvVar3) {
          uVar12 = uVar12 | local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [lVar10 + (uVar14 - 1)];
        }
        else {
          uVar12 = ~uVar12 & local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             [lVar10 + (uVar14 - 1)];
        }
        local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[lVar10 + (uVar14 - 1)] = uVar12;
        uVar16 = uVar16 + 1;
      } while (__n + (__n == 0) != uVar16);
    }
    core::std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
    ::vector(&local_60,__n,(allocator_type *)&local_a0);
    (local_d0->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar13 = (t->
              super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_80 = (t->
               super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar13 != local_80) {
      do {
        local_68 = pvVar13;
        core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
        vector(&local_48,pvVar13);
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        if (local_78 != local_70) {
          lVar15 = 8;
          lVar10 = 0;
          uVar16 = 0;
          do {
            uVar12 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar12 = uVar16;
            }
            if ((local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar12 >> 6) +
                  ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar16 & 0x3f) & 1) == 0) {
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              lVar4 = *(long *)((long)&(local_48.
                                        super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->tag + lVar15);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,lVar4,
                         *(long *)((long)&((local_48.
                                            super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->str).
                                          _M_dataplus._M_p + lVar15) + lVar4);
              pmVar5 = local_60.
                       super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              cVar7 = core::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)(&((local_60.
                                    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                  field_0x0 + lVar10),&local_a0);
              this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(&((local_60.
                               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                           lVar10);
              if ((_Base_ptr)
                  ((long)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color + lVar10)
                  == cVar7._M_node) {
                uVar9 = *(undefined8 *)
                         ((long)&((local_60.
                                   super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                 super__Rb_tree_header._M_node_count + lVar10);
                pmVar8 = core::std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::operator[](this_00,&local_a0);
                iVar11 = (int)uVar9;
                *pmVar8 = iVar11;
                local_ec = (float)iVar11;
                if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  core::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_e8,
                             (iterator)
                             local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_ec);
                }
                else {
                  *local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_ec;
                  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              else {
                pmVar8 = core::std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::operator[](this_00,&local_a0);
                local_ec = (float)*pmVar8;
                if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  core::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_e8,
                             (iterator)
                             local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_ec);
                }
                else {
                  *local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_ec;
                  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
            }
            else {
              __args = (float *)((long)local_48.
                                       super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar15 + -4);
              if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_e8,
                           (iterator)
                           local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,__args);
              }
              else {
                *local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = *__args;
                local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar16 = uVar16 + 1;
            lVar10 = lVar10 + 0x30;
            lVar15 = lVar15 + 0x28;
          } while (__n + (__n == 0) != uVar16);
        }
        core::std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::push_back(local_d0,&local_e8);
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
        ~vector(&local_48);
        pvVar13 = local_68 + 1;
      } while (pvVar13 != local_80);
    }
    core::std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
    ::~vector(&local_60);
    if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return local_d0;
  }
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  _Unwind_Resume(uVar9);
}

Assistant:

NumericTable
    convertToNumeric(const MixedTable &t) {
        // analyze table
        size_t ncols = t.at(0).size();
        std::vector<bool> isNumeric(ncols);
        for (size_t i = 0; i < ncols; ++i) {
            isNumeric[i] = isColumnNumeric(t, i);
        }
        // convert table
        std::vector<std::map<std::string, int>> columnKeys(ncols);
        NumericTable nt;
        for (auto row : t) {
            NumericRow nr;
            for (size_t i = 0; i < ncols; ++i) {
                if (isNumeric[i]) {
                    nr.push_back(row[i].value);
                } else { // a non-numeric label
                    auto label = row[i].str;
                    if (columnKeys[i].count(label)) { // a previosly seen label
                        int labelIndex = columnKeys[i][label];
                        nr.push_back(labelIndex);
                    } else { // new label
                        int labelIndex = columnKeys[i].size();
                        columnKeys[i][label] = labelIndex;
                        nr.push_back(labelIndex);
                    }
                }
            }
            nt.push_back(nr);
        }
        return nt;
    }